

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O0

void __thiscall
bgui::FileImageWindow::FileImageWindow
          (FileImageWindow *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,int firstfile,bool watch,int x,int y,int w,int h,bool size_max,double init_scale,
          double init_min,double init_max,double valid_min,double valid_max,keep k,mapping m,int c,
          char *viewcmd)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  FileImageWindow *pFVar2;
  bool bVar3;
  undefined8 uVar4;
  byte in_CL;
  undefined4 in_EDX;
  BaseWindow *in_RDI;
  int in_R8D;
  int in_R9D;
  BaseWindowData *in_XMM0_Qa;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_XMM1_Qa;
  BaseWindowData *in_XMM2_Qa;
  _func_int **in_XMM3_Qa;
  BaseWindowData *in_XMM4_Qa;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  undefined4 in_stack_00000030;
  char *in_stack_00000038;
  uint *in_stack_000000d8;
  undefined4 in_stack_000000e4;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ImageWindow *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  allocator *paVar5;
  BaseWindow *this_00;
  string local_a8 [8];
  ImageWindow *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  IOException *in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [32];
  BaseWindowData *local_50;
  _func_int **local_48;
  BaseWindowData *local_40;
  
  local_50 = in_XMM4_Qa;
  local_48 = in_XMM3_Qa;
  local_40 = in_XMM2_Qa;
  ImageWindow::ImageWindow(in_stack_ffffffffffffff60);
  in_RDI->_vptr_BaseWindow = (_func_int **)&PTR__FileImageWindow_001c4f40;
  this_00 = (BaseWindow *)&in_RDI[5].p;
  std::__cxx11::string::string((string *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1412a8);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
  if (!bVar3) {
    (anonymous_namespace)::createHelpText_abi_cxx11_(files._7_1_);
    ImageWindow::addHelpText
              (in_stack_ffffffffffffff30,
               (string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    std::__cxx11::string::~string(local_a8);
    if (in_stack_00000038 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&in_RDI[5].p,in_stack_00000038);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_XMM0_Qa,in_XMM1_Qa);
    *(undefined4 *)&in_RDI[9]._vptr_BaseWindow = in_EDX;
    in_RDI[9].p = in_XMM0_Qa;
    in_RDI[10]._vptr_BaseWindow = (_func_int **)in_XMM1_Qa;
    in_RDI[10].p = local_40;
    in_RDI[0xb]._vptr_BaseWindow = local_48;
    in_RDI[0xb].p = local_50;
    *(undefined4 *)&in_RDI[0xc]._vptr_BaseWindow = in_stack_00000020;
    *(undefined4 *)((long)&in_RDI[0xc]._vptr_BaseWindow + 4) = in_stack_00000028;
    *(undefined4 *)&in_RDI[0xc].p = in_stack_00000030;
    *(byte *)((long)&in_RDI[0xc].p + 4) = in_CL & 1;
    *(undefined4 *)&in_RDI[0xd]._vptr_BaseWindow = 0xffffffff;
    if ((in_stack_00000008 < 1) || (pvVar1 = files, pFVar2 = this, in_stack_00000010 < 1)) {
      BaseWindow::getDisplaySize(in_RDI,&stack0x00000008,&stack0x00000010);
      pvVar1 = files;
      pFVar2 = this;
    }
    this._0_4_ = (int)pFVar2;
    files._4_4_ = (int)((ulong)pvVar1 >> 0x20);
    this._7_1_ = SUB81((ulong)pFVar2 >> 0x38,0);
    files._3_1_ = SUB81((ulong)pvVar1 >> 0x18,0);
    load((FileImageWindow *)CONCAT44(in_stack_000000e4,w),in_stack_000000d8,this._7_1_,(int)this,
         files._4_4_,files._3_1_);
    this = pFVar2;
    files = pvVar1;
    BaseWindow::setVisible
              (&in_stack_ffffffffffffff30->super_BaseWindow,(bool)in_stack_ffffffffffffff2f);
    if ((-1 < in_R8D) && (-1 < in_R9D)) {
      BaseWindow::setPosition
                (this_00,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 (int)in_stack_ffffffffffffff38);
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  paVar5 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"The list of files must not be empty",paVar5);
  gutil::IOException::IOException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

FileImageWindow::FileImageWindow(const std::vector<std::string> &files, int firstfile,
                                 bool watch, int x, int y, int w, int h, bool size_max, double init_scale,
                                 double init_min, double init_max, double valid_min, double valid_max, keep k,
                                 mapping m, int c, const char *viewcmd)
{
  if (files.empty())
  {
    throw gutil::IOException("The list of files must not be empty");
  }

  addHelpText(createHelpText(viewcmd != 0));

  if (viewcmd != 0)
  {
    vc=viewcmd;
  }

  list=files;
  current=firstfile;

  scale=init_scale;
  imin=init_min;
  imax=init_max;
  vmin=valid_min;
  vmax=valid_max;
  kp=k;
  map=m;
  channel=c;
  watch_file=watch;
  wid=-1;

  if (w <= 0 || h <= 0)
  {
    getDisplaySize(w, h);
    size_max=true;
  }

  load(current, true, w, h, size_max);

  setVisible(true);

  if (x >= 0 && y >= 0)
  {
    setPosition(x, y);
  }
}